

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

void Saig_ManDupCones_rec
               (Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vRoots)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    if (0xfffffffd < (uVar1 & 7) - 7) break;
    uVar1 = uVar1 & 7;
    if (uVar1 != 3) {
      if (uVar1 != 2) {
LAB_006d8ce4:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                      ,0x21f,
                      "void Saig_ManDupCones_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      if ((pObj->field_0).CioId < p->nTruePis) {
        if ((pObj->field_0).CioId < p->nTruePis) {
          Vec_PtrPush(vLeaves,pObj);
          return;
        }
        goto LAB_006d8ce4;
      }
      if ((pObj->field_0).CioId < p->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar1 = ((pObj->field_0).CioId - p->nTruePis) + p->nTruePos;
      if (((int)uVar1 < 0) || (p->vCos->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pObj = (Aig_Obj_t *)p->vCos->pArray[uVar1];
      uVar1 = vRoots->nCap;
      if (vRoots->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar2;
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar1 * 2;
          if (iVar3 <= (int)uVar1) goto LAB_006d8cc8;
          if (vRoots->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar2 = (void **)realloc(vRoots->pArray,(ulong)uVar1 << 4);
          }
          vRoots->pArray = ppvVar2;
        }
        vRoots->nCap = iVar3;
      }
LAB_006d8cc8:
      ppvVar2 = vRoots->pArray;
      iVar3 = vRoots->nSize;
      vRoots->nSize = iVar3 + 1;
      goto LAB_006d8cd6;
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  Saig_ManDupCones_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vLeaves,vNodes,vRoots);
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_006d8c92;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar3;
  }
LAB_006d8c92:
  ppvVar2 = vNodes->pArray;
  iVar3 = vNodes->nSize;
  vNodes->nSize = iVar3 + 1;
LAB_006d8cd6:
  ppvVar2[iVar3] = pObj;
  return;
}

Assistant:

void Saig_ManDupCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Saig_ManDupCones_rec( p, Aig_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Aig_ObjIsCo(pObj) )
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Saig_ObjIsLo(p, pObj) )
        Vec_PtrPush( vRoots, Saig_ObjLoToLi(p, pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}